

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefidump.h
# Opt level: O0

void __thiscall UEFIDumper::UEFIDumper(UEFIDumper *this)

{
  UEFIDumper *this_local;
  
  TreeModel::TreeModel(&this->model);
  FfsParser::FfsParser(&this->ffsParser,&this->model);
  FfsReport::FfsReport(&this->ffsReport,&this->model);
  UByteArray::UByteArray(&this->currentBuffer);
  this->initialized = false;
  this->dumped = false;
  return;
}

Assistant:

explicit UEFIDumper() : model(), ffsParser(&model), ffsReport(&model), currentBuffer(), initialized(false), dumped(false) {}